

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_ctx.cc
# Opt level: O2

int EVP_PKEY_derive(EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  int line;
  
  if (((ctx == (EVP_PKEY_CTX *)0x0) || (*(long *)ctx == 0)) ||
     (UNRECOVERED_JUMPTABLE = *(code **)(*(long *)ctx + 0x60), UNRECOVERED_JUMPTABLE == (code *)0x0)
     ) {
    iVar1 = 0x7d;
    line = 0x161;
  }
  else {
    if (*(int *)(ctx + 0x20) == 0x100) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)();
      return iVar1;
    }
    iVar1 = 0x7e;
    line = 0x165;
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_ctx.cc"
                ,line);
  return 0;
}

Assistant:

int EVP_PKEY_derive(EVP_PKEY_CTX *ctx, uint8_t *key, size_t *out_key_len) {
  if (!ctx || !ctx->pmeth || !ctx->pmeth->derive) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATION_NOT_SUPPORTED_FOR_THIS_KEYTYPE);
    return 0;
  }
  if (ctx->operation != EVP_PKEY_OP_DERIVE) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_OPERATON_NOT_INITIALIZED);
    return 0;
  }
  return ctx->pmeth->derive(ctx, key, out_key_len);
}